

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_test.cpp
# Opt level: O0

void __thiscall Spectrum_Blackbody_Test::TestBody(Spectrum_Blackbody_Test *this)

{
  bool bVar1;
  float *val1;
  float *val2;
  Float FVar2;
  Float FVar3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  Float lambda_1 [3];
  Float lambdaMax;
  Float T_1;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<int> *__range1;
  AssertionResult gtest_ar;
  Float LeExpected;
  Float T;
  Float lambda;
  int i;
  int n;
  Float v [4] [3];
  anon_class_1_0_00000001 err;
  Float in_stack_fffffffffffffe68;
  Float in_stack_fffffffffffffe6c;
  initializer_list<int> *in_stack_fffffffffffffe70;
  AssertionResult *in_stack_fffffffffffffe78;
  Float T_00;
  Float in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  AssertionResult *this_00;
  Type in_stack_fffffffffffffe9c;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertionResult local_130;
  Message *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  AssertionResult local_108;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  double *in_stack_ffffffffffffff20;
  float *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 uVar6;
  initializer_list<int> local_b8;
  initializer_list<int> *local_a8;
  undefined8 local_80;
  float local_74;
  AssertionResult local_70;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined4 local_48 [18];
  
  memcpy(local_48,&DAT_00b3bd40,0x30);
  local_4c = 4;
  for (local_50 = 0; local_50 < local_4c; local_50 = local_50 + 1) {
    local_54 = local_48[(long)local_50 * 3];
    local_58 = local_48[(long)local_50 * 3 + 1];
    local_5c = local_48[(long)local_50 * 3 + 2];
    pbrt::Blackbody(in_stack_fffffffffffffe80,(Float)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    local_74 = TestBody::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)in_stack_fffffffffffffe70,
                          in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    local_80 = 0x3f50624dd2f1a9fc;
    testing::internal::CmpHelperLT<float,double>
              ((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffea0);
      in_stack_fffffffffffffea0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x65bf48);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90,
                 (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
      testing::Message::~Message((Message *)0x65bfa5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x65bffa);
  }
  uVar4 = 0xa8c;
  uVar5 = 3000;
  uVar6 = 0x1194;
  local_b8._M_array = (iterator)&stack0xffffffffffffff34;
  local_b8._M_len = 5;
  local_a8 = &local_b8;
  val1 = (float *)std::initializer_list<int>::begin(local_a8);
  val2 = (float *)std::initializer_list<int>::end(in_stack_fffffffffffffe70);
  for (; T_00 = (Float)((ulong)in_stack_fffffffffffffe78 >> 0x20), val1 != val2; val1 = val1 + 1) {
    local_e4 = (float)(int)*val1;
    local_f0 = (0.002897772 / local_e4) * 1e+09;
    local_f4 = local_f0 * 0.999;
    local_ec = local_f0 * 1.001;
    local_e8 = local_f0;
    FVar2 = pbrt::Blackbody(in_stack_fffffffffffffe80,T_00);
    FVar3 = pbrt::Blackbody(in_stack_fffffffffffffe80,T_00);
    this_00 = &local_108;
    testing::internal::CmpHelperLT<float,float>
              ((char *)CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,in_stack_ffffffffffffff30),val1,
               val2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    in_stack_fffffffffffffe9c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe9c);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffea0);
      in_stack_fffffffffffffe88 =
           testing::AssertionResult::failure_message((AssertionResult *)0x65c222);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,&this_00->success_,
                 (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(FVar2,FVar3),in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
      testing::Message::~Message((Message *)0x65c276);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x65c2cb);
    pbrt::Blackbody(in_stack_fffffffffffffe80,T_00);
    pbrt::Blackbody(in_stack_fffffffffffffe80,T_00);
    in_stack_fffffffffffffe78 = &local_130;
    testing::internal::CmpHelperGT<float,float>
              ((char *)CONCAT44(uVar6,uVar5),(char *)CONCAT44(uVar4,in_stack_ffffffffffffff30),val1,
               val2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe84 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe84);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffea0);
      in_stack_fffffffffffffe70 =
           (initializer_list<int> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x65c38c);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,&this_00->success_,
                 (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(FVar2,FVar3),in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
      testing::Message::~Message((Message *)0x65c3da);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x65c426);
  }
  return;
}

Assistant:

TEST(Spectrum, Blackbody) {
    // Relative error.
    auto err = [](Float val, Float ref) { return std::abs(val - ref) / ref; };

    // Planck's law.
    // A few values via
    // http://www.spectralcalc.com/blackbody_calculator/blackbody.php
    // lambda, T, expected radiance
    Float v[][3] = {
        {483, 6000, 3.1849e13},
        {600, 6000, 2.86772e13},
        {500, 3700, 1.59845e12},
        {600, 4500, 7.46497e12},
    };
    int n = PBRT_ARRAYSIZE(v);
    for (int i = 0; i < n; ++i) {
        Float lambda = v[i][0], T = v[i][1], LeExpected = v[i][2];
        EXPECT_LT(err(Blackbody(lambda, T), LeExpected), .001);
    }

    // Use Wien's displacement law to compute maximum wavelength for a few
    // temperatures, then confirm that the value returned by Blackbody() is
    // consistent with this.
    for (Float T : {2700, 3000, 4500, 5600, 6000}) {
        Float lambdaMax = 2.8977721e-3 / T * 1e9;
        Float lambda[3] = {Float(.999 * lambdaMax), lambdaMax, Float(1.001 * lambdaMax)};
        EXPECT_LT(Blackbody(lambda[0], T), Blackbody(lambda[1], T));
        EXPECT_GT(Blackbody(lambda[1], T), Blackbody(lambda[2], T));
    }
}